

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

ssize_t __thiscall smf::MidiFile::read(MidiFile *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort uVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong __new_size;
  MidiEventList *pMVar5;
  void *__buf_00;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  istream *input;
  undefined1 uVar9;
  uint uVar10;
  ulong uVar11;
  uchar runningCommand;
  string filename;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  MidiEvent event;
  
  input = (istream *)CONCAT44(in_register_00000034,__fd);
  this->m_rwstatus = true;
  iVar2 = std::istream::peek();
  if (iVar2 != 0x4d) {
    std::__cxx11::stringstream::stringstream((stringstream *)&event);
    Binasc::Binasc((Binasc *)&filename);
    Binasc::writeToBinary
              ((Binasc *)&filename,
               (ostream *)
               &event.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,input);
    std::istream::seekg((long)&event,_S_beg);
    iVar2 = std::istream::peek();
    if (iVar2 == 0x4d) {
      uVar8 = read(this,(int)&event,__buf_00,__nbytes);
      uVar9 = (undefined1)uVar8;
      uVar8 = uVar8 & 0xffffffff;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Bad MIDI data input");
      uVar9 = false;
      std::endl<char,std::char_traits<char>>(poVar3);
      uVar8 = 0;
    }
    this->m_rwstatus = (bool)uVar9;
    Binasc::~Binasc((Binasc *)&filename);
    std::__cxx11::stringstream::~stringstream((stringstream *)&event);
    goto LAB_0011711b;
  }
  std::__cxx11::string::string
            ((string *)&filename,(this->m_readFileName)._M_dataplus._M_p,(allocator *)&event);
  iVar2 = std::istream::get();
  if (iVar2 == 0x4d) {
    iVar2 = std::istream::get();
    if (iVar2 != 0x54) {
      if (iVar2 == -1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"In file ");
        poVar3 = std::operator<<(poVar3,(string *)&filename);
        poVar3 = std::operator<<(poVar3,": unexpected end of file.");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Expecting \'T\' at second byte, but found nothing.");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
        poVar3 = std::operator<<(poVar3,(string *)&filename);
        poVar3 = std::operator<<(poVar3," is not a MIDI file");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cerr,"Expecting \'T\' at second byte but got \'");
        poVar3 = std::operator<<(poVar3,(char)iVar2);
        poVar3 = std::operator<<(poVar3,"\'");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      goto LAB_0011710b;
    }
    iVar2 = std::istream::get();
    if (iVar2 != 0x68) {
      if (iVar2 == -1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"In file ");
        poVar3 = std::operator<<(poVar3,(string *)&filename);
        poVar3 = std::operator<<(poVar3,": unexpected end of file.");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Expecting \'h\' at third byte, but found nothing.");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
        poVar3 = std::operator<<(poVar3,(string *)&filename);
        poVar3 = std::operator<<(poVar3," is not a MIDI file");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cerr,"Expecting \'h\' at third byte but got \'");
        poVar3 = std::operator<<(poVar3,(char)iVar2);
        poVar3 = std::operator<<(poVar3,"\'");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      goto LAB_0011710b;
    }
    iVar2 = std::istream::get();
    if (iVar2 != 100) {
      if (iVar2 == -1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"In file ");
        poVar3 = std::operator<<(poVar3,(string *)&filename);
        poVar3 = std::operator<<(poVar3,": unexpected end of file.");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Expecting \'d\' at fourth byte, but found nothing.");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
        poVar3 = std::operator<<(poVar3,(string *)&filename);
        poVar3 = std::operator<<(poVar3," is not a MIDI file");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cerr,"Expecting \'d\' at fourth byte but got \'");
        poVar3 = std::operator<<(poVar3,(char)iVar2);
        poVar3 = std::operator<<(poVar3,"\'");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      goto LAB_0011710b;
    }
    uVar4 = readLittleEndian4Bytes(input);
    if (uVar4 != 6) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar3 = std::operator<<(poVar3,(string *)&filename);
      poVar3 = std::operator<<(poVar3," is not a MIDI 1.0 Standard MIDI file.");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cerr,"The header size is ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," bytes.");
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_0011710b;
    }
    uVar1 = readLittleEndian2Bytes(input);
    if (uVar1 == 0) {
      bVar6 = 1;
    }
    else {
      if (uVar1 != 1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error: cannot handle a type-");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
        poVar3 = std::operator<<(poVar3," MIDI file");
        std::endl<char,std::char_traits<char>>(poVar3);
        goto LAB_0011710b;
      }
      bVar6 = 0;
    }
    uVar1 = readLittleEndian2Bytes(input);
    uVar8 = 0;
    __new_size = (ulong)uVar1;
    if (!(bool)(bVar6 ^ 1) && uVar1 != 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Error: Type 0 MIDI file can only contain one track");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cerr,"Instead track count is: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_0011710b;
    }
    clear(this);
    pMVar5 = *(this->m_events).
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (pMVar5 != (MidiEventList *)0x0) {
      MidiEventList::~MidiEventList(pMVar5);
      operator_delete(pMVar5);
    }
    std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
              (&this->m_events,__new_size);
    for (uVar11 = 0; __new_size != uVar11; uVar11 = uVar11 + 1) {
      pMVar5 = (MidiEventList *)operator_new(0x18);
      MidiEventList::MidiEventList(pMVar5);
      (this->m_events).
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11] = pMVar5;
      MidiEventList::reserve
                ((this->m_events).
                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11],10000);
      MidiEventList::clear
                ((this->m_events).
                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11]);
    }
    uVar1 = readLittleEndian2Bytes(input);
    uVar10 = (uint)uVar1;
    if ((short)uVar1 < 0) {
      uVar7 = (uVar1 >> 8) + 0x1e;
      if ((byte)uVar7 < 7) {
        if ((99U >> (uVar7 & 0x1f) & 1) == 0) goto LAB_001171e6;
        uVar7 = *(uint *)(&DAT_00121b24 + (ulong)(uVar7 & 0xff) * 4);
      }
      else {
LAB_001171e6:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Warning: unknown FPS: ");
        uVar7 = 0x100 - (uVar1 >> 8);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar7);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cerr,"Using non-standard FPS: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar7);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      uVar8 = (ulong)uVar7;
      uVar10 = (uVar10 & 0xff) * uVar7;
    }
    this->m_ticksPerQuarterNote = uVar10;
    MidiEvent::MidiEvent(&event);
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar11 = 0; uVar11 != __new_size; uVar11 = uVar11 + 1) {
      runningCommand = '\0';
      iVar2 = std::istream::get();
      if (iVar2 != 0x4d) {
        if (iVar2 == -1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"In file ");
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          poVar3 = std::operator<<(poVar3,": unexpected end of file.");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'M\' at first byte in track, but found nothing.");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          poVar3 = std::operator<<(poVar3," is not a MIDI file");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'M\' at first byte in track but got \'");
          poVar3 = std::operator<<(poVar3,(char)iVar2);
          poVar3 = std::operator<<(poVar3,"\'");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
LAB_001176ea:
        this->m_rwstatus = false;
        uVar8 = 0;
        goto LAB_001176f0;
      }
      iVar2 = std::istream::get();
      if (iVar2 != 0x54) {
        if (iVar2 == -1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"In file ");
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          poVar3 = std::operator<<(poVar3,": unexpected end of file.");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'T\' at second byte in track, but found nothing.");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          poVar3 = std::operator<<(poVar3," is not a MIDI file");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'T\' at second byte in track but got \'");
          poVar3 = std::operator<<(poVar3,(char)iVar2);
          poVar3 = std::operator<<(poVar3,"\'");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        goto LAB_001176ea;
      }
      iVar2 = std::istream::get();
      if (iVar2 != 0x72) {
        if (iVar2 == -1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"In file ");
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          poVar3 = std::operator<<(poVar3,": unexpected end of file.");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'r\' at third byte in track, but found nothing.");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          poVar3 = std::operator<<(poVar3," is not a MIDI file");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'r\' at third byte in track but got \'");
          poVar3 = std::operator<<(poVar3,(char)iVar2);
          poVar3 = std::operator<<(poVar3,"\'");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        goto LAB_001176ea;
      }
      iVar2 = std::istream::get();
      if (iVar2 != 0x6b) {
        if (iVar2 == -1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"In file ");
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          poVar3 = std::operator<<(poVar3,": unexpected end of file.");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'k\' at fourth byte in track, but found nothing.");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          poVar3 = std::operator<<(poVar3," is not a MIDI file");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'k\' at fourth byte in track but got \'");
          poVar3 = std::operator<<(poVar3,(char)iVar2);
          poVar3 = std::operator<<(poVar3,"\'");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        goto LAB_001176ea;
      }
      uVar4 = readLittleEndian4Bytes(input);
      MidiEventList::reserve
                ((this->m_events).
                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11],
                 (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 2));
      MidiEventList::clear
                ((this->m_events).
                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11]);
      uVar8 = 0;
      while (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
        uVar4 = readVLValue(this,input);
        iVar2 = extractMidiData(this,input,&bytes,&runningCommand);
        if (iVar2 == 0) goto LAB_001176ea;
        MidiMessage::setMessage(&event.super_MidiMessage,&bytes);
        uVar8 = uVar4 + (long)(int)uVar8;
        event.tick = (int)uVar8;
        event.track = (int)uVar11;
        if ((*bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == 0xff) &&
           (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[1] == '/')) {
          MidiEventList::push_back
                    ((this->m_events).
                     super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11],&event);
          break;
        }
        MidiEventList::push_back
                  ((this->m_events).
                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11],&event);
      }
    }
    this->m_theTimeState = 1;
    markSequence(this);
    uVar8 = CONCAT71((int7)(uVar8 >> 8),this->m_rwstatus);
LAB_001176f0:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    MidiEvent::~MidiEvent(&event);
  }
  else {
    if (iVar2 == -1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"In file ");
      poVar3 = std::operator<<(poVar3,(string *)&filename);
      poVar3 = std::operator<<(poVar3,": unexpected end of file.");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Expecting \'M\' at first byte, but found nothing.");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar3 = std::operator<<(poVar3,(string *)&filename);
      poVar3 = std::operator<<(poVar3," is not a MIDI file");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cerr,"Expecting \'M\' at first byte but got \'");
      poVar3 = std::operator<<(poVar3,(char)iVar2);
      poVar3 = std::operator<<(poVar3,"\'");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
LAB_0011710b:
    this->m_rwstatus = false;
    uVar8 = 0;
  }
  std::__cxx11::string::~string((string *)&filename);
LAB_0011711b:
  return uVar8 & 0xffffffff;
}

Assistant:

bool MidiFile::read(std::istream& input) {
	m_rwstatus = true;
	if (input.peek() != 'M') {
		// If the first byte in the input stream is not 'M', then presume that
		// the MIDI file is in the binasc format which is an ASCII representation
		// of the MIDI file.  Convert the binasc content into binary content and
		// then continue reading with this function.
		std::stringstream binarydata;
		Binasc binasc;
		binasc.writeToBinary(binarydata, input);
		binarydata.seekg(0, std::ios_base::beg);
		if (binarydata.peek() != 'M') {
			std::cerr << "Bad MIDI data input" << std::endl;
			m_rwstatus = false;
			return m_rwstatus;
		} else {
			m_rwstatus = read(binarydata);
			return m_rwstatus;
		}
	}

	std::string filename = getFilename();

	int    character;
	// uchar  buffer[123456] = {0};
	ulong  longdata;
	ushort shortdata;


	// Read the MIDI header (4 bytes of ID, 4 byte data size,
	// anticipated 6 bytes of data.

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'M' at first byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'M') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'M' at first byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'T' at second byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'T') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'T' at second byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'h' at third byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'h') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'h' at third byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'd' at fourth byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'd') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'd' at fourth byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// read header size (allow larger header size?)
	longdata = readLittleEndian4Bytes(input);
	if (longdata != 6) {
		std::cerr << "File " << filename
		     << " is not a MIDI 1.0 Standard MIDI file." << std::endl;
		std::cerr << "The header size is " << longdata << " bytes." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #1: format type
	int type;
	shortdata = readLittleEndian2Bytes(input);
	switch (shortdata) {
		case 0:
			type = 0;
			break;
		case 1:
			type = 1;
			break;
		case 2:
			// Type-2 MIDI files should probably be allowed as well,
			// but I have never seen one in the wild to test with.
		default:
			std::cerr << "Error: cannot handle a type-" << shortdata
			     << " MIDI file" << std::endl;
			m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #2: track count
	int tracks;
	shortdata = readLittleEndian2Bytes(input);
	if (type == 0 && shortdata != 1) {
		std::cerr << "Error: Type 0 MIDI file can only contain one track" << std::endl;
		std::cerr << "Instead track count is: " << shortdata << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else {
		tracks = shortdata;
	}
	clear();
	if (m_events[0] != NULL) {
		delete m_events[0];
	}
	m_events.resize(tracks);
	for (int z=0; z<tracks; z++) {
		m_events[z] = new MidiEventList;
		m_events[z]->reserve(10000);   // Initialize with 10,000 event storage.
		m_events[z]->clear();
	}

	// Header parameter #3: Ticks per quarter note
	shortdata = readLittleEndian2Bytes(input);
	if (shortdata >= 0x8000) {
		int framespersecond = 255 - ((shortdata >> 8) & 0x00ff) + 1;
		int subframes       = shortdata & 0x00ff;
		switch (framespersecond) {
			case 25:  framespersecond = 25; break;
			case 24:  framespersecond = 24; break;
			case 29:  framespersecond = 29; break;  // really 29.97 for color television
			case 30:  framespersecond = 30; break;
			default:
					std::cerr << "Warning: unknown FPS: " << framespersecond << std::endl;
					std::cerr << "Using non-standard FPS: " << framespersecond << std::endl;
		}
		m_ticksPerQuarterNote = framespersecond * subframes;

		// std::cerr << "SMPTE ticks: " << m_ticksPerQuarterNote << " ticks/sec" << std::endl;
		// std::cerr << "SMPTE frames per second: " << framespersecond << std::endl;
		// std::cerr << "SMPTE subframes per frame: " << subframes << std::endl;
	}  else {
		m_ticksPerQuarterNote = shortdata;
	}


	//////////////////////////////////////////////////
	//
	// now read individual tracks:
	//

	uchar runningCommand;
	MidiEvent event;
	std::vector<uchar> bytes;
	int xstatus;
	// int barline;

	for (int i=0; i<tracks; i++) {
		runningCommand = 0;

		// std::cout << "\nReading Track: " << i + 1 << flush;

		// read track header...

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'M' at first byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'M') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'M' at first byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'T' at second byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'T') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'T' at second byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'r' at third byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'r') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'r' at third byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'k') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		// Now read track chunk size and throw it away because it is
		// not really necessary since the track MUST end with an
		// end of track meta event, and many MIDI files found in the wild
		// do not correctly give the track size.
		longdata = readLittleEndian4Bytes(input);

		// set the size of the track allocation so that it might
		// approximately fit the data.
		m_events[i]->reserve((int)longdata/2);
		m_events[i]->clear();

		// process the track
		int absticks = 0;
		// barline = 1;
		while (!input.eof()) {
			longdata = readVLValue(input);
			//std::cout << "ticks = " << longdata << std::endl;
			absticks += longdata;
			xstatus = extractMidiData(input, bytes, runningCommand);
			if (xstatus == 0) {
				m_rwstatus = false;  return m_rwstatus;
			}
			event.setMessage(bytes);
			//std::cout << "command = " << std::hex << (int)event.data[0] << std::dec << std::endl;
			if (bytes[0] == 0xff && (bytes[1] == 1 ||
					bytes[1] == 2 || bytes[1] == 3 || bytes[1] == 4)) {
				// mididata.push_back('\0');
				// std::cout << '\t';
				// for (int m=0; m<event.data[2]; m++) {
				//    std::cout << event.data[m+3];
				// }
				// std::cout.flush();
			} else if (bytes[0] == 0xff && bytes[1] == 0x2f) {
				// end of track message
				// uncomment out the following three lines if you don't want
				// to see the end of track message (which is always required,
				// and added automatically when a MIDI is written.
				event.tick = absticks;
				event.track = i;
				m_events[i]->push_back(event);
				break;
			}

			if (bytes[0] != 0xff && bytes[0] != 0xf0) {
				event.tick = absticks;
				event.track = i;
				m_events[i]->push_back(event);
			} else {
				event.tick = absticks;
				event.track = i;
				m_events[i]->push_back(event);
			}

		}

	}

	m_theTimeState = TIME_STATE_ABSOLUTE;
	markSequence();
	return m_rwstatus;
}